

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

iterator __thiscall
spvtools::utils::SmallVector<unsigned_int,2ul>::insert<unsigned_int_const*>
          (SmallVector<unsigned_int,2ul> *this,iterator pos,uint *first,uint *last)

{
  SmallVector<unsigned_int,2ul> *pSVar1;
  iterator puVar2;
  long lVar3;
  SmallVector<unsigned_int,2ul> *pSVar4;
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  
  pSVar4 = *(SmallVector<unsigned_int,2ul> **)(this + 0x20);
  pSVar1 = pSVar4;
  if (pSVar4 == (SmallVector<unsigned_int,2ul> *)0x0) {
    pSVar1 = this + 0x18;
  }
  lVar7 = (long)last - (long)first >> 2;
  lVar3 = *(long *)pSVar1;
  uVar6 = *(long *)(this + 8) + lVar7;
  if (2 < uVar6 && pSVar4 == (SmallVector<unsigned_int,2ul> *)0x0) {
    SmallVector<unsigned_int,_2UL>::MoveToLargeData((SmallVector<unsigned_int,_2UL> *)this);
    pSVar4 = *(SmallVector<unsigned_int,2ul> **)(this + 0x20);
  }
  if (pSVar4 == (SmallVector<unsigned_int,2ul> *)0x0) {
    lVar3 = *(long *)(this + 0x18);
    puVar2 = SmallVector<unsigned_int,_2UL>::end((SmallVector<unsigned_int,_2UL> *)this);
    puVar5 = (uint *)(uVar6 * 4 + -4 + lVar3);
    while (puVar2 = puVar2 + -1, pos <= puVar2) {
      *puVar5 = *puVar2;
      puVar5 = puVar5 + -1;
    }
    for (lVar3 = 0; (uint *)((long)first + lVar3) != last; lVar3 = lVar3 + 4) {
      *(uint *)((long)pos + lVar3) = *(uint *)((long)first + lVar3);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + lVar7;
  }
  else {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)pSVar4,
               (uint *)((long)pos + (*(long *)pSVar4 - lVar3)),first,last);
    pSVar4 = this + 0x18;
    if (*(SmallVector<unsigned_int,2ul> **)(this + 0x20) != (SmallVector<unsigned_int,2ul> *)0x0) {
      pSVar4 = *(SmallVector<unsigned_int,2ul> **)(this + 0x20);
    }
    pos = (iterator)((long)pos + (*(long *)pSVar4 - lVar3));
  }
  return pos;
}

Assistant:

iterator insert(iterator pos, InputIt first, InputIt last) {
    size_t element_idx = (pos - begin());
    size_t num_of_new_elements = std::distance(first, last);
    size_t new_size = size_ + num_of_new_elements;
    if (!large_data_ && new_size > small_size) {
      MoveToLargeData();
    }

    if (large_data_) {
      typename std::vector<T>::iterator new_pos =
          large_data_->begin() + element_idx;
      large_data_->insert(new_pos, first, last);
      return begin() + element_idx;
    }

    // Move |pos| and all of the elements after it over |num_of_new_elements|
    // places.  We start at the end and work backwards, to make sure we do not
    // overwrite data that we have not moved yet.
    for (iterator i = begin() + new_size - 1, j = end() - 1; j >= pos;
         --i, --j) {
      if (i >= begin() + size_) {
        new (i) T(std::move(*j));
      } else {
        *i = std::move(*j);
      }
    }

    // Copy the new elements into position.
    iterator p = pos;
    for (; first != last; ++p, ++first) {
      if (p >= small_data_ + size_) {
        new (p) T(*first);
      } else {
        *p = *first;
      }
    }

    // Update the size.
    size_ += num_of_new_elements;
    return pos;
  }